

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool build_simple(chunk *c,loc_conflict centre,wchar_t rating)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  wchar_t wVar8;
  uint32_t uVar9;
  loc lVar10;
  square *psVar11;
  int iVar12;
  wchar_t x1;
  wchar_t wVar13;
  wchar_t x1_00;
  uint uVar14;
  wchar_t y1;
  wchar_t x2;
  uint32_t uVar15;
  int iVar16;
  wchar_t y2;
  wchar_t wVar17;
  wchar_t y1_00;
  loc_conflict centre_local;
  
  centre_local = centre;
  uVar3 = Rand_div(4);
  uVar4 = Rand_div(3);
  uVar5 = Rand_div(0xb);
  uVar6 = Rand_div(0xb);
  wVar13 = uVar4 + uVar3 + L'\x05';
  wVar17 = uVar6 + 5 + uVar5;
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar13,wVar17);
  if (((centre_local.y < c->height) && (centre_local.x < c->width)) ||
     (_Var2 = find_space(&centre_local,wVar13,wVar17), _Var2)) {
    iVar7 = uVar4 + uVar3 + 3;
    iVar12 = uVar6 + 3 + uVar5;
    iVar16 = centre_local.x;
    iVar1 = centre_local.y;
    y1_00 = centre_local.y - iVar7 / 2;
    x1 = centre_local.x - iVar12 / 2;
    y2 = y1_00 + iVar7;
    wVar17 = iVar7 + y1_00 + L'\xffffffff';
    x2 = x1 + iVar12;
    wVar8 = iVar12 + -1 + x1;
    wVar13 = c->depth;
    uVar9 = Rand_div(0x19);
    y1 = (iVar1 - iVar7 / 2) + L'\xffffffff';
    x1_00 = (iVar16 - iVar12 / 2) + L'\xffffffff';
    generate_room(c,y1,x1_00,y2,x2,(uint)(wVar13 <= uVar9 + L'\x01'));
    uVar15 = 0;
    draw_rectangle(c,y1,x1_00,y2,x2,FEAT_GRANITE,L'\f',false);
    fill_rectangle(c,y1_00,x1,wVar17,wVar8,FEAT_FLOOR,L'\0');
    uVar9 = Rand_div(0x14);
    if (uVar9 == 0) {
      uVar14 = wVar8 - x1;
      if ((uVar14 & 1) != 0) {
        uVar15 = Rand_div(2);
      }
      uVar3 = 0;
      if ((wVar17 - y1_00 & 1U) != 0) {
        uVar3 = Rand_div(2);
      }
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillared");
      if ((int)uVar3 < iVar7) {
        wVar13 = y1_00 + uVar3;
        do {
          wVar8 = x1 + uVar15;
          if ((int)uVar15 < iVar12) {
            do {
              lVar10 = (loc)loc(wVar8,wVar13);
              square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
              generate_mark(c,lVar10.y,lVar10.x,lVar10.y,lVar10.x,L'\v');
              wVar8 = wVar8 + L'\x02';
            } while (wVar8 < x2);
          }
          wVar13 = wVar13 + L'\x02';
        } while (wVar13 < y2);
      }
      if (uVar3 == 0) {
        if (uVar15 == 0) {
          lVar10 = (loc)loc(x1_00,y1);
          psVar11 = square((chunk_conflict *)c,lVar10);
          flag_off(psVar11->info,3,4);
          lVar10 = (loc)loc(x1_00,y1);
          psVar11 = square((chunk_conflict *)c,lVar10);
          flag_off(psVar11->info,3,0xc);
        }
        if ((uVar14 - uVar15 & 1) == 0) {
          lVar10 = (loc)loc(x2,y1);
          psVar11 = square((chunk_conflict *)c,lVar10);
          flag_off(psVar11->info,3,4);
          lVar10 = (loc)loc(x2,y1);
          psVar11 = square((chunk_conflict *)c,lVar10);
          flag_off(psVar11->info,3,0xc);
        }
      }
      _Var2 = true;
      if (((wVar17 - y1_00) - uVar3 & 1U) == 0) {
        if (uVar15 == 0) {
          lVar10 = (loc)loc(x1_00,y2);
          psVar11 = square((chunk_conflict *)c,lVar10);
          flag_off(psVar11->info,3,4);
          lVar10 = (loc)loc(x1_00,y2);
          psVar11 = square((chunk_conflict *)c,lVar10);
          flag_off(psVar11->info,3,0xc);
        }
        if ((uVar14 - uVar15 & 1) == 0) {
          lVar10 = (loc)loc(x2,y2);
          psVar11 = square((chunk_conflict *)c,lVar10);
          flag_off(psVar11->info,3,4);
          lVar10 = (loc)loc(x2,y2);
          psVar11 = square((chunk_conflict *)c,lVar10);
          flag_off(psVar11->info,3,0xc);
        }
      }
    }
    else {
      uVar9 = Rand_div(0x32);
      _Var2 = true;
      if (uVar9 == 0) {
        uVar15 = 0;
        uVar9 = 0;
        if ((wVar8 - x1 & 1U) != 0) {
          uVar9 = Rand_div(2);
        }
        if ((wVar17 - y1_00 & 1U) != 0) {
          uVar15 = Rand_div(2);
        }
        event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"ragged");
        iVar16 = uVar15 + y1_00;
        while (iVar16 = iVar16 + 2, iVar16 <= uVar4 + uVar3 + y1_00) {
          lVar10 = (loc)loc(x1,iVar16);
          square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
          generate_mark(c,lVar10.y,lVar10.x,lVar10.y,lVar10.x,L'\v');
          lVar10 = (loc)loc(wVar8,iVar16);
          square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
          generate_mark(c,lVar10.y,lVar10.x,lVar10.y,lVar10.x,L'\v');
        }
        iVar16 = uVar9 + x1;
        while (iVar16 = iVar16 + 2, iVar16 <= uVar6 + uVar5 + x1) {
          lVar10 = (loc)loc(iVar16,y1_00);
          square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
          generate_mark(c,lVar10.y,lVar10.x,lVar10.y,lVar10.x,L'\v');
          lVar10 = (loc)loc(iVar16,wVar17);
          square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
          generate_mark(c,lVar10.y,lVar10.x,lVar10.y,lVar10.x,L'\v');
        }
        _Var2 = true;
      }
    }
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool build_simple(struct chunk *c, struct loc centre, int rating)
{
	int y, x, y1, x1, y2, x2;
	int light = false;

	/* Pick a room size */
	int height = 1 + randint1(4) + randint1(3);
	int width = 1 + randint1(11) + randint1(11);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Set bounds */
	y1 = centre.y - height / 2;
	x1 = centre.x - width / 2;
	y2 = y1 + height - 1;
	x2 = x1 + width - 1;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Generate new room */
	generate_room(c, y1-1, x1-1, y2+1, x2+1, light);

	/* Generate outer walls and inner floors */
	draw_rectangle(c, y1-1, x1-1, y2+1, x2+1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	if (one_in_(20)) {
		/*
		 * Sometimes make a pillar room.
		 * If a dimension is even, don't always put a pillar in the
		 * upper left corner.
		 */
		int offx = ((x2 - x1) % 2 == 0) ? 0 : randint0(2);
		int offy = ((y2 - y1) % 2 == 0) ? 0 : randint0(2);

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "pillared");

		for (y = y1 + offy; y <= y2; y += 2)
			for (x = x1 + offx; x <= x2; x += 2)
				set_marked_granite(c, loc(x, y), SQUARE_WALL_INNER);
		/*
		 * Drop room/outer wall flags on corners if not adjacent to a
		 * floor.  Lets tunnels enter those grids.
		 */
		if (!offy) {
			if (!offx) {
				sqinfo_off(square(c, loc(x1 - 1, y1 - 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x1 - 1, y1 - 1))->info,
					SQUARE_WALL_OUTER);
			}
			if ((x2 - x1 - offx) % 2 == 0) {
				sqinfo_off(square(c, loc(x2 + 1, y1 - 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x2 + 1, y1 - 1))->info,
					SQUARE_WALL_OUTER);
			}
		}
		if ((y2 - y1 - offy) % 2 == 0) {
			if (!offx) {
				sqinfo_off(square(c, loc(x1 - 1, y2 + 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x1 - 1, y2 + 1))->info,
					SQUARE_WALL_OUTER);
			}
			if ((x2 - x1 - offx) % 2 == 0) {
				sqinfo_off(square(c, loc(x2 + 1, y2 + 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x2 + 1, y2 + 1))->info,
					SQUARE_WALL_OUTER);
			}
		}
	} else if (one_in_(50)) {
		/*
		 * Sometimes make a ragged-edge room.
		 * If a dimension is even, don't always put the first
		 * indentations at (x1, y1 + 2) and (x1 + 2, y1).
		 */
		int offx = ((x2 - x1) % 2 == 0) ? 0 : randint0(2);
		int offy = ((y2 - y1) % 2 == 0) ? 0 : randint0(2);

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "ragged");

		for (y = y1 + 2 + offy; y <= y2 - 2; y += 2) {
			set_marked_granite(c, loc(x1, y), SQUARE_WALL_INNER);
			set_marked_granite(c, loc(x2, y), SQUARE_WALL_INNER);
		}

		for (x = x1 + 2 + offx; x <= x2 - 2; x += 2) {
			set_marked_granite(c, loc(x, y1), SQUARE_WALL_INNER);
			set_marked_granite(c, loc(x, y2), SQUARE_WALL_INNER);
		}
	}
	return true;
}